

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O2

MPP_RET mpp_trie_init_by_root(MppTrie *trie,void *root)

{
  undefined8 *trie_00;
  MppTrieInfo *pMVar1;
  MppTrieInfo *pMVar2;
  MppTrieInfo *pMVar3;
  uint uVar4;
  ulong uVar5;
  MppTrieInfo *name;
  
  if (trie == (MppTrie *)0x0 || root == (void *)0x0) {
    _mpp_log_l(2,"mpp_trie","invalid trie %px root %px\n","mpp_trie_init_by_root",trie,root);
  }
  else {
    *trie = (MppTrie)0x0;
    trie_00 = (undefined8 *)mpp_osal_calloc("mpp_trie_init_by_root",0x58);
    if (trie_00 == (undefined8 *)0x0) {
      _mpp_log_l(2,"mpp_trie","create trie impl failed\n","mpp_trie_init_by_root");
    }
    else {
      pMVar1 = mpp_trie_get_info_from_root(root,"__name__");
      if (pMVar1 != (MppTrieInfo *)0x0) {
        *trie_00 = &pMVar1[1].field_0x0 + (byte)pMVar1->field_0x3;
      }
      pMVar1 = mpp_trie_get_info_from_root(root,"__node__");
      if (pMVar1 != (MppTrieInfo *)0x0) {
        *(undefined4 *)((long)trie_00 + 0x2c) =
             *(undefined4 *)(&pMVar1[1].field_0x0 + (byte)pMVar1->field_0x3);
      }
      pMVar1 = mpp_trie_get_info_from_root(root,"__info__");
      if (pMVar1 != (MppTrieInfo *)0x0) {
        *(undefined4 *)(trie_00 + 3) =
             *(undefined4 *)(&pMVar1[1].field_0x0 + (byte)pMVar1->field_0x3);
      }
      trie_00[6] = root;
      if ((mpp_trie_debug._1_1_ & 1) != 0) {
        mpp_trie_dump(trie_00,"root import");
        root = (void *)trie_00[6];
      }
      uVar4 = 0;
      pMVar1 = (MppTrieInfo *)((long)*(int *)((long)trie_00 + 0x2c) * 0x38 + (long)root);
      while( true ) {
        if (*(int *)(trie_00 + 3) <= (int)uVar4) {
          *trie = trie_00;
          return MPP_OK;
        }
        name = pMVar1 + 1;
        if (pMVar1 == (MppTrieInfo *)0x0) {
          name = (MppTrieInfo *)0x0;
        }
        pMVar2 = mpp_trie_get_info(trie_00,(char *)name);
        pMVar3 = mpp_trie_get_info_next(trie_00,pMVar1);
        if ((pMVar2 == (MppTrieInfo *)0x0) || (pMVar1 != pMVar2)) break;
        uVar5 = (ulong)((uint)*pMVar2 & 0xfff);
        if (uVar4 != ((uint)*pMVar2 & 0xfff)) goto LAB_0013753e;
        uVar4 = uVar4 + 1;
        pMVar1 = pMVar3;
      }
      if (pMVar2 == (MppTrieInfo *)0x0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = (ulong)((uint)*pMVar2 & 0xfff);
      }
LAB_0013753e:
      _mpp_log_l(2,"mpp_trie","trie check on import found mismatch info %s [%d:%p] - [%d:%p]\n",
                 "mpp_trie_init_by_root",name,(ulong)uVar4,pMVar1,uVar5,pMVar2);
    }
  }
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_trie_init_by_root(MppTrie *trie, void *root)
{
    MppTrieImpl *p;
    MppTrieInfo *info;
    RK_S32 i;

    if (!trie || !root) {
        mpp_loge_f("invalid trie %px root %px\n", trie, root);
        return MPP_NOK;
    }

    *trie = NULL;
    p = mpp_calloc_size(MppTrieImpl, sizeof(MppTrieImpl));
    if (!p) {
        mpp_err_f("create trie impl failed\n");
        return MPP_NOK;
    }

    info = mpp_trie_get_info_from_root(root, "__name__");
    if (info)
        p->name = (char *)mpp_trie_info_ctx(info);

    info = mpp_trie_get_info_from_root(root, "__node__");
    if (info)
        p->node_used = *(RK_U32 *)mpp_trie_info_ctx(info);

    info = mpp_trie_get_info_from_root(root, "__info__");
    if (info)
        p->info_used = *(RK_U32 *)mpp_trie_info_ctx(info);

    /* import and update new buffer */
    p->nodes = (MppTrieNode *)root;

    if (mpp_trie_debug & MPP_TRIE_DBG_IMPORT)
        mpp_trie_dump(p, "root import");

    info = mpp_trie_get_info_first(p);

    for (i = 0; i < p->info_used; i++) {
        const char *name = mpp_trie_info_name(info);
        MppTrieInfo *info_set = info;
        MppTrieInfo *info_ret = mpp_trie_get_info(p, name);

        info = mpp_trie_get_info_next(p, info);

        if (info_ret && info_set == info_ret && info_ret->index == i)
            continue;

        mpp_loge_f("trie check on import found mismatch info %s [%d:%p] - [%d:%p]\n",
                   name, i, info_set, info_ret ? info_ret->index : -1, info_ret);
        return MPP_NOK;
    }

    *trie = p;

    return MPP_OK;
}